

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableNoCopy_abi_cxx11_
          (ArenaStringPtr *this,Arena *arena)

{
  void *pvVar1;
  string *psVar2;
  LogMessageFatal LStack_18;
  
  pvVar1 = (this->tagged_ptr_).ptr_;
  if (((ulong)pvVar1 & 2) != 0) {
    return (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
  }
  if (((ulong)pvVar1 & 1) == 0) {
    psVar2 = NewString<>(this,arena);
    return psVar2;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.cc"
             ,0xc4,"IsDefault()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

uintptr_t as_int() const { return reinterpret_cast<uintptr_t>(ptr_); }